

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O3

int run_test_ip6_pton(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  in6_addr addr;
  undefined1 auStack_18 [16];
  
  puVar2 = (uv_loop_t *)0xa;
  iVar1 = uv_inet_pton(10,"::",auStack_18);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eda1;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015eda6;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015edab;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1",auStack_18);
    if (iVar1 != 0) goto LAB_0015edb0;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015edb5;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015edba;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015edbf;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1",auStack_18);
    if (iVar1 != 0) goto LAB_0015edc4;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015edc9;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015edce;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015edd3;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::",auStack_18);
    if (iVar1 != 0) goto LAB_0015edd8;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eddd;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ede2;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ede7;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a",auStack_18);
    if (iVar1 != 0) goto LAB_0015edec;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015edf1;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015edf6;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015edfb;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee00;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee05;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee0a;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee0f;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee14;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee19;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee1e;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee23;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee28;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee2d;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee32;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ee37;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee3c;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee41;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee46;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee4b;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee50;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee55;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee5a;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee5f;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee64;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee69;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee6e;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee73;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee78;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee7d;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee82;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee87;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee8c;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee91;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee96;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ee9b;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255",auStack_18);
    if (iVar1 == 0) goto LAB_0015eea0;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015eea5;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015eeaa;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1:1.2.3.4",
                         auStack_18);
    if (iVar1 != 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015eeb4;
    }
  }
  else {
    run_test_ip6_pton_cold_1();
LAB_0015eda1:
    run_test_ip6_pton_cold_2();
LAB_0015eda6:
    run_test_ip6_pton_cold_3();
LAB_0015edab:
    run_test_ip6_pton_cold_4();
LAB_0015edb0:
    run_test_ip6_pton_cold_5();
LAB_0015edb5:
    run_test_ip6_pton_cold_6();
LAB_0015edba:
    run_test_ip6_pton_cold_7();
LAB_0015edbf:
    run_test_ip6_pton_cold_8();
LAB_0015edc4:
    run_test_ip6_pton_cold_9();
LAB_0015edc9:
    run_test_ip6_pton_cold_10();
LAB_0015edce:
    run_test_ip6_pton_cold_11();
LAB_0015edd3:
    run_test_ip6_pton_cold_12();
LAB_0015edd8:
    run_test_ip6_pton_cold_13();
LAB_0015eddd:
    run_test_ip6_pton_cold_14();
LAB_0015ede2:
    run_test_ip6_pton_cold_15();
LAB_0015ede7:
    run_test_ip6_pton_cold_16();
LAB_0015edec:
    run_test_ip6_pton_cold_17();
LAB_0015edf1:
    run_test_ip6_pton_cold_18();
LAB_0015edf6:
    run_test_ip6_pton_cold_19();
LAB_0015edfb:
    run_test_ip6_pton_cold_20();
LAB_0015ee00:
    run_test_ip6_pton_cold_21();
LAB_0015ee05:
    run_test_ip6_pton_cold_22();
LAB_0015ee0a:
    run_test_ip6_pton_cold_23();
LAB_0015ee0f:
    run_test_ip6_pton_cold_24();
LAB_0015ee14:
    run_test_ip6_pton_cold_25();
LAB_0015ee19:
    run_test_ip6_pton_cold_26();
LAB_0015ee1e:
    run_test_ip6_pton_cold_27();
LAB_0015ee23:
    run_test_ip6_pton_cold_28();
LAB_0015ee28:
    run_test_ip6_pton_cold_29();
LAB_0015ee2d:
    run_test_ip6_pton_cold_30();
LAB_0015ee32:
    run_test_ip6_pton_cold_31();
LAB_0015ee37:
    run_test_ip6_pton_cold_32();
LAB_0015ee3c:
    run_test_ip6_pton_cold_57();
LAB_0015ee41:
    run_test_ip6_pton_cold_56();
LAB_0015ee46:
    run_test_ip6_pton_cold_55();
LAB_0015ee4b:
    run_test_ip6_pton_cold_54();
LAB_0015ee50:
    run_test_ip6_pton_cold_53();
LAB_0015ee55:
    run_test_ip6_pton_cold_52();
LAB_0015ee5a:
    run_test_ip6_pton_cold_51();
LAB_0015ee5f:
    run_test_ip6_pton_cold_50();
LAB_0015ee64:
    run_test_ip6_pton_cold_49();
LAB_0015ee69:
    run_test_ip6_pton_cold_48();
LAB_0015ee6e:
    run_test_ip6_pton_cold_47();
LAB_0015ee73:
    run_test_ip6_pton_cold_46();
LAB_0015ee78:
    run_test_ip6_pton_cold_45();
LAB_0015ee7d:
    run_test_ip6_pton_cold_44();
LAB_0015ee82:
    run_test_ip6_pton_cold_43();
LAB_0015ee87:
    run_test_ip6_pton_cold_42();
LAB_0015ee8c:
    run_test_ip6_pton_cold_41();
LAB_0015ee91:
    run_test_ip6_pton_cold_40();
LAB_0015ee96:
    run_test_ip6_pton_cold_39();
LAB_0015ee9b:
    run_test_ip6_pton_cold_38();
LAB_0015eea0:
    run_test_ip6_pton_cold_37();
LAB_0015eea5:
    run_test_ip6_pton_cold_36();
LAB_0015eeaa:
    run_test_ip6_pton_cold_35();
  }
  run_test_ip6_pton_cold_34();
LAB_0015eeb4:
  run_test_ip6_pton_cold_33();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ip6_pton) {
  struct in6_addr addr;

  GOOD_ADDR_LIST(TEST_GOOD)
  BAD_ADDR_LIST(TEST_BAD)

  MAKE_VALGRIND_HAPPY();
  return 0;
}